

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O3

void dd_Init(void)

{
  int iVar1;
  FILE *pFVar2;
  undefined1 auVar3 [16];
  int number;
  char buffer [1024];
  int local_43c;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char local_428;
  
  pFVar2 = OpenDataFile("r");
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = __isoc99_fscanf(pFVar2,"%s%d",&local_438,&local_43c);
    if (iVar1 != -1) {
      do {
        if (cStack_430 == '\0' &&
            CONCAT17(cStack_431,
                     CONCAT16(cStack_432,
                              CONCAT15(cStack_433,
                                       CONCAT14(cStack_434,
                                                CONCAT13(cStack_435,
                                                         CONCAT12(cStack_436,
                                                                  CONCAT11(cStack_437,local_438)))))
                             )) == 0x3a65726f63736968) {
          StoredData.m_highScore = local_43c;
        }
        else {
          auVar3[0] = -(local_438 == 'c');
          auVar3[1] = -(cStack_437 == 'o');
          auVar3[2] = -(cStack_436 == 'l');
          auVar3[3] = -(cStack_435 == 'o');
          auVar3[4] = -(cStack_434 == 'r');
          auVar3[5] = -(cStack_433 == 's');
          auVar3[6] = -(cStack_432 == 'c');
          auVar3[7] = -(cStack_431 == 'h');
          auVar3[8] = -(cStack_430 == 'e');
          auVar3[9] = -(cStack_42f == 'm');
          auVar3[10] = -(cStack_42e == 'e');
          auVar3[0xb] = -(cStack_42d == 'i');
          auVar3[0xc] = -(cStack_42c == 'd');
          auVar3[0xd] = -(cStack_42b == 'x');
          auVar3[0xe] = -(cStack_42a == ':');
          auVar3[0xf] = -(cStack_429 == '\0');
          if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
            StoredData.m_colorScheme1 = local_43c;
          }
          else if ((local_428 == '\0' &&
                   CONCAT17(cStack_431,
                            CONCAT16(cStack_432,
                                     CONCAT15(cStack_433,
                                              CONCAT14(cStack_434,
                                                       CONCAT13(cStack_435,
                                                                CONCAT12(cStack_436,
                                                                         CONCAT11(cStack_437,
                                                                                  local_438)))))))
                   == 0x686373726f6c6f63) &&
                   CONCAT17(cStack_429,
                            CONCAT16(cStack_42a,
                                     CONCAT15(cStack_42b,
                                              CONCAT14(cStack_42c,
                                                       CONCAT13(cStack_42d,
                                                                CONCAT12(cStack_42e,
                                                                         CONCAT11(cStack_42f,
                                                                                  cStack_430)))))))
                   == 0x3a78646932656d65) {
            StoredData.m_colorScheme2 = local_43c;
          }
        }
        iVar1 = __isoc99_fscanf(pFVar2,"%s%d",&local_438,&local_43c);
      } while (iVar1 != -1);
    }
    ActiveData.m_colorScheme2 = StoredData.m_colorScheme2;
    ActiveData.m_colorScheme1 = StoredData.m_colorScheme1;
    ActiveData.m_highScore = StoredData.m_highScore;
  }
  return;
}

Assistant:

void dd_Init(void)
{
  char buffer[1024];
  int number;
  FILE* fp = OpenDataFile("r");

  if (fp) {
    while (fscanf(fp, "%s%d", buffer, &number) != EOF) {
      if (strcmp(buffer, HighScoreLabel) == RET_OK) {
        StoredData.m_highScore = number;
      } else if (strcmp(buffer, ColorScheme1IdxLabel) == RET_OK) {
        StoredData.m_colorScheme1 = number;
      } else if (strcmp(buffer, ColorScheme2IdxLabel) == RET_OK) {
        StoredData.m_colorScheme2 = number;
      }
    }
    ActiveData = StoredData;
  }
}